

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O1

Index __thiscall wasm::DataFlow::Users::getNumUses(Users *this,Node *node)

{
  UserSet *pUVar1;
  __node_base *p_Var2;
  Index IVar3;
  bool bVar4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  
  pUVar1 = getUsers(this,node);
  p_Var2 = &(pUVar1->_M_h)._M_before_begin;
  IVar3 = 0;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return IVar3;
    }
    bVar4 = false;
    for (p_Var5 = p_Var2[1]._M_nxt[3]._M_nxt; p_Var5 != p_Var2[1]._M_nxt[4]._M_nxt;
        p_Var5 = p_Var5 + 1) {
      bVar6 = (Node *)p_Var5->_M_nxt == node;
      if (bVar6) {
        bVar4 = true;
      }
      IVar3 = IVar3 + bVar6;
    }
  } while (bVar4);
  __assert_fail("found",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/users.h"
                ,0x4b,"Index wasm::DataFlow::Users::getNumUses(Node *)");
}

Assistant:

Index getNumUses(Node* node) {
    auto& users = getUsers(node);
    // A user may have more than one use
    Index numUses = 0;
    for (auto* user : users) {
#ifndef NDEBUG
      bool found = false;
#endif
      for (auto* value : user->values) {
        if (value == node) {
          numUses++;
#ifndef NDEBUG
          found = true;
#endif
        }
      }
      assert(found);
    }
    return numUses;
  }